

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O1

void DES_decrypt3(uint *data,DES_key_schedule *ks1,DES_key_schedule *ks2,DES_key_schedule *ks3)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (data[1] >> 4 ^ *data) & 0xf0f0f0f;
  uVar2 = *data ^ uVar1;
  uVar1 = uVar1 << 4 ^ data[1];
  uVar3 = uVar1 & 0xffff ^ uVar2 >> 0x10;
  uVar1 = uVar1 ^ uVar3;
  uVar2 = uVar3 << 0x10 ^ uVar2;
  uVar3 = (uVar1 >> 2 ^ uVar2) & 0x33333333;
  uVar2 = uVar2 ^ uVar3;
  uVar1 = uVar3 << 2 ^ uVar1;
  uVar3 = (uVar2 >> 8 ^ uVar1) & 0xff00ff;
  uVar1 = uVar1 ^ uVar3;
  uVar2 = uVar3 << 8 ^ uVar2;
  uVar3 = (uVar1 >> 1 ^ uVar2) & 0x55555555;
  *data = uVar2 ^ uVar3;
  data[1] = uVar3 * 2 ^ uVar1;
  DES_encrypt2(data,ks3,0);
  DES_encrypt2(data,ks2,1);
  DES_encrypt2(data,ks1,0);
  uVar1 = (data[1] >> 1 ^ *data) & 0x55555555;
  uVar2 = *data ^ uVar1;
  uVar1 = uVar1 * 2 ^ data[1];
  uVar3 = (uVar2 >> 8 ^ uVar1) & 0xff00ff;
  uVar1 = uVar1 ^ uVar3;
  uVar2 = uVar3 << 8 ^ uVar2;
  uVar3 = (uVar1 >> 2 ^ uVar2) & 0x33333333;
  uVar2 = uVar2 ^ uVar3;
  uVar1 = uVar3 << 2 ^ uVar1;
  uVar3 = uVar1 & 0xffff ^ uVar2 >> 0x10;
  uVar1 = uVar1 ^ uVar3;
  uVar2 = uVar3 << 0x10 ^ uVar2;
  uVar3 = (uVar1 >> 4 ^ uVar2) & 0xf0f0f0f;
  *data = uVar2 ^ uVar3;
  data[1] = uVar3 << 4 ^ uVar1;
  return;
}

Assistant:

void DES_decrypt3(uint32_t data[2], const DES_key_schedule *ks1,
                  const DES_key_schedule *ks2, const DES_key_schedule *ks3) {
  uint32_t l, r;

  l = data[0];
  r = data[1];
  IP(l, r);
  data[0] = l;
  data[1] = r;
  DES_encrypt2(data, ks3, DES_DECRYPT);
  DES_encrypt2(data, ks2, DES_ENCRYPT);
  DES_encrypt2(data, ks1, DES_DECRYPT);
  l = data[0];
  r = data[1];
  FP(r, l);
  data[0] = l;
  data[1] = r;
}